

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O1

int main(void)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  sunrealtype *psVar3;
  sunrealtype *psVar4;
  uint uVar5;
  UserData paVar6;
  sunrealtype **ppsVar7;
  sunindextype *psVar8;
  sunrealtype *psVar9;
  N_Vector p_Var10;
  N_Vector p_Var11;
  int linsolver;
  undefined8 uVar12;
  int maxlrst;
  long lVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  UserData paVar20;
  int maxl;
  long lVar21;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  sunrealtype in_XMM1_Qa;
  void *kmem;
  SUNContext sunctx;
  sunrealtype stemp [6];
  sunrealtype ctemp [6];
  void *local_d8;
  undefined8 local_d0;
  int local_c4;
  N_Vector local_c0;
  long local_b8;
  long local_b0;
  UserData local_a8;
  long *local_a0;
  undefined8 auStack_98 [6];
  undefined8 auStack_68 [7];
  
  lVar15 = 0;
  local_d0 = 0;
  SUNContext_Create(0);
  local_d8 = (void *)0x0;
  paVar6 = (UserData)malloc(0x1f8);
  paVar20 = paVar6;
  do {
    lVar21 = 0;
    do {
      ppsVar7 = (sunrealtype **)SUNDlsMat_newDenseMat(6,6);
      paVar20->P[0][lVar21] = ppsVar7;
      psVar8 = (sunindextype *)SUNDlsMat_newIndexArray(6);
      paVar20->pivot[0][lVar21] = psVar8;
      lVar21 = lVar21 + 1;
    } while (lVar21 != 5);
    lVar15 = lVar15 + 1;
    paVar20 = (UserData)(paVar20->P + 1);
  } while (lVar15 != 5);
  ppsVar7 = (sunrealtype **)SUNDlsMat_newDenseMat(6,6);
  paVar6->acoef = ppsVar7;
  psVar9 = (sunrealtype *)malloc(0x30);
  paVar6->bcoef = psVar9;
  psVar9 = (sunrealtype *)malloc(0x30);
  paVar6->cox = psVar9;
  psVar9 = (sunrealtype *)malloc(0x30);
  paVar6->coy = psVar9;
  if (paVar6 == (UserData)0x0) {
    main_cold_10();
  }
  else {
    paVar6->mx = 5;
    paVar6->my = 5;
    paVar6->ns = 6;
    paVar6->np = 3;
    paVar6->ax = 1.0;
    paVar6->ay = 1.0;
    paVar6->dx = 0.25;
    paVar6->dy = 0.25;
    *(undefined4 *)&paVar6->uround = 0;
    *(undefined4 *)((long)&paVar6->uround + 4) = 0x3cb00000;
    *(undefined4 *)&paVar6->sqruround = 0;
    *(undefined4 *)((long)&paVar6->sqruround + 4) = 0x3e500000;
    ppsVar7 = paVar6->acoef;
    psVar9 = paVar6->bcoef;
    psVar1 = paVar6->cox;
    psVar2 = paVar6->coy;
    lVar15 = 0;
    do {
      psVar3 = ppsVar7[lVar15];
      psVar4 = ppsVar7[lVar15 + 3];
      lVar21 = 0;
      do {
        psVar3[lVar21 + 3] = -5e-07;
        psVar4[lVar21] = 10000.0;
        psVar3[lVar21] = 0.0;
        psVar4[lVar21 + 3] = 0.0;
        lVar21 = lVar21 + 1;
      } while ((int)lVar21 != 3);
      psVar3[lVar15] = -1.0;
      psVar4[lVar15 + 3] = -1.0;
      psVar9[lVar15] = 1.0;
      psVar9[lVar15 + 3] = -1.0;
      psVar1[lVar15] = 16.0;
      psVar1[lVar15 + 3] = 8.0;
      psVar2[lVar15] = 16.0;
      psVar2[lVar15 + 3] = 8.0;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_a8 = paVar6;
    p_Var10 = (N_Vector)N_VNew_Serial(0x96,local_d0);
    if (p_Var10 == (N_Vector)0x0) {
      main_cold_9();
    }
    else {
      local_a0 = (long *)N_VNew_Serial(0x96,local_d0);
      if (local_a0 == (long *)0x0) {
        main_cold_8();
      }
      else {
        p_Var11 = (N_Vector)N_VNew_Serial(0x96,local_d0);
        local_a8->rates = p_Var11;
        if (p_Var11 == (N_Vector)0x0) {
          main_cold_7();
        }
        else {
          local_b0 = N_VNew_Serial(0x96,local_d0);
          if (local_b0 != 0) {
            local_c0 = p_Var10;
            N_VConst(0,local_b0);
            local_b8 = 0;
            maxl = 0;
            do {
              lVar15 = 0;
              do {
                auStack_68[lVar15] = 0x3ff0000000000000;
                auStack_98[lVar15] = 0x3ff0000000000000;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 3);
              lVar15 = 3;
              do {
                auStack_68[lVar15] = 0x40dd4c0000000000;
                auStack_98[lVar15] = 0x3ee4f8b588e368f1;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 6);
              lVar15 = *(long *)((long)local_c0->content + 0x10);
              lVar21 = *(long *)(*local_a0 + 0x10);
              lVar13 = 0;
              do {
                lVar18 = 0;
                lVar16 = lVar15;
                lVar17 = lVar21;
                do {
                  lVar19 = 0;
                  do {
                    *(undefined8 *)(lVar16 + lVar19 * 8) = auStack_68[lVar19];
                    *(undefined8 *)(lVar17 + lVar19 * 8) = auStack_98[lVar19];
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != 6);
                  lVar18 = lVar18 + 1;
                  lVar17 = lVar17 + 0x30;
                  lVar16 = lVar16 + 0x30;
                } while (lVar18 != 5);
                lVar13 = lVar13 + 1;
                lVar21 = lVar21 + 0xf0;
                lVar15 = lVar15 + 0xf0;
              } while (lVar13 != 5);
              local_d8 = (void *)KINCreate(local_d0);
              linsolver = (int)lVar21;
              if (local_d8 == (void *)0x0) {
                main_cold_5();
                return 1;
              }
              uVar5 = KINInit(local_d8,func,local_c0);
              if ((int)uVar5 < 0) {
                pcVar14 = "KINInit";
                goto LAB_00102cb0;
              }
              uVar5 = KINSetUserData(local_d8,local_a8);
              if ((int)uVar5 < 0) {
                pcVar14 = "KINSetUserData";
                goto LAB_00102cb0;
              }
              uVar5 = KINSetConstraints(local_d8,local_b0);
              if ((int)uVar5 < 0) {
                pcVar14 = "KINSetConstraints";
                goto LAB_00102cb0;
              }
              uVar5 = KINSetFuncNormTol(0x9abcaf48,local_d8);
              if ((int)uVar5 < 0) {
                pcVar14 = "KINSetFuncNormTol";
                goto LAB_00102cb0;
              }
              uVar5 = KINSetScaledStepTol(0x68497682,local_d8);
              if ((int)uVar5 < 0) {
                pcVar14 = "KINSetScaledStepTol";
                goto LAB_00102cb0;
              }
              switch(maxl) {
              case 0:
                printf(" -------");
                puts(" \n| SPGMR |");
                puts(" -------");
                uVar12 = local_d0;
                lVar15 = SUNLinSol_SPGMR(local_c0,2,0xf);
                linsolver = (int)uVar12;
                if (lVar15 == 0) {
                  main_cold_4();
                  return 1;
                }
                break;
              case 1:
                printf(" --------");
                puts(" \n| SPBCGS |");
                puts(" --------");
                uVar12 = local_d0;
                lVar15 = SUNLinSol_SPBCGS(local_c0,2,0xf);
                linsolver = (int)uVar12;
                if (lVar15 == 0) {
                  main_cold_3();
                  return 1;
                }
                local_b8 = lVar15;
                uVar5 = KINSetLinearSolver(local_d8,lVar15,0);
                local_c4 = 0xf;
                goto LAB_00102aa2;
              case 2:
                printf(" ---------");
                puts(" \n| SPTFQMR |");
                puts(" ---------");
                uVar12 = local_d0;
                lVar15 = SUNLinSol_SPTFQMR(local_c0,2,0x19);
                linsolver = (int)uVar12;
                if (lVar15 == 0) {
                  main_cold_2();
                  return 1;
                }
                local_b8 = lVar15;
                uVar5 = KINSetLinearSolver(local_d8,lVar15,0);
                local_c4 = 0x19;
LAB_00102aa2:
                if ((int)uVar5 < 0) goto LAB_00102c7e;
                goto switchD_001028fb_default;
              case 3:
                printf(" -------");
                puts(" \n| SPFGMR |");
                puts(" -------");
                uVar12 = local_d0;
                lVar15 = SUNLinSol_SPFGMR(local_c0,2,0xf);
                linsolver = (int)uVar12;
                if (lVar15 == 0) {
                  main_cold_1();
                  return 1;
                }
                break;
              default:
                goto switchD_001028fb_default;
              }
              uVar5 = KINSetLinearSolver(local_d8,lVar15,0);
              if ((int)uVar5 < 0) {
LAB_00102c7e:
                pcVar14 = "KINSetLinearSolver";
LAB_00102cb0:
                fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar14,
                        (ulong)uVar5);
                return 1;
              }
              local_b8 = lVar15;
              uVar5 = SUNLinSol_SPGMRSetMaxRestarts(lVar15,2);
              local_c4 = 0xf;
              if ((int)uVar5 < 0) {
                pcVar14 = "SUNLinSol_SPGMRSetMaxRestarts";
                goto LAB_00102cb0;
              }
switchD_001028fb_default:
              uVar5 = KINSetPreconditioner(local_d8,PrecSetupBD,PrecSolveBD);
              if ((int)uVar5 < 0) {
                pcVar14 = "KINSetPreconditioner";
                goto LAB_00102cb0;
              }
              PrintHeader(local_c4,maxl,maxlrst,
                          (sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),in_XMM1_Qa,
                          linsolver);
              p_Var10 = local_c0;
              uVar5 = KINSol(local_d8,local_c0,0);
              if ((int)uVar5 < 0) {
                pcVar14 = "KINSol";
                goto LAB_00102cb0;
              }
              puts("\n\nComputed equilibrium species concentrations:");
              PrintOutput(p_Var10);
              PrintFinalStats(local_d8,maxl);
              KINFree(&local_d8);
              SUNLinSolFree(local_b8);
              maxl = maxl + 1;
              if (maxl == 4) {
                N_VDestroy(local_b0);
                N_VDestroy(local_c0);
                N_VDestroy(local_a0);
                FreeUserData(local_a8);
                SUNContext_Free(&local_d0);
                return 0;
              }
            } while( true );
          }
          main_cold_6();
        }
      }
    }
  }
  return 1;
}

Assistant:

int main(void)
{
  int globalstrategy, linsolver;
  sunrealtype fnormtol, scsteptol;
  N_Vector cc, sc, constraints;
  UserData data;
  int flag, maxl, maxlrst;
  void* kmem;
  SUNLinearSolver LS;

  /* Create the SUNDIALS context object for this simulation. */
  SUNContext sunctx = NULL;
  SUNContext_Create(SUN_COMM_NULL, &sunctx);

  cc = sc = constraints = NULL;
  kmem                  = NULL;
  LS                    = NULL;
  data                  = NULL;

  /* Allocate memory, and set problem data, initial values, tolerances */
  globalstrategy = KIN_NONE;

  data = AllocUserData();
  if (check_flag((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);

  /* Create serial vectors of length NEQ */
  cc = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)cc, "N_VNew_Serial", 0)) { return (1); }
  sc = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)sc, "N_VNew_Serial", 0)) { return (1); }
  data->rates = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)data->rates, "N_VNew_Serial", 0)) { return (1); }

  constraints = N_VNew_Serial(NEQ, sunctx);
  if (check_flag((void*)constraints, "N_VNew_Serial", 0)) { return (1); }
  N_VConst(TWO, constraints);

  fnormtol  = FTOL;
  scsteptol = STOL;

  /* START: Loop through SPGMR, SPBCGS, SPTFQMR and SPFGMR linear solver modules */
  for (linsolver = 0; linsolver < 4; ++linsolver)
  {
    /* (Re-)Initialize user data */
    SetInitialProfiles(cc, sc);

    /* Call KINCreate/KINInit to initialize KINSOL:
       A pointer to KINSOL problem memory is returned and stored in kmem. */
    kmem = KINCreate(sunctx);
    if (check_flag((void*)kmem, "KINCreate", 0)) { return (1); }

    /* Vector cc passed as template vector. */
    flag = KINInit(kmem, func, cc);
    if (check_flag(&flag, "KINInit", 1)) { return (1); }

    flag = KINSetUserData(kmem, data);
    if (check_flag(&flag, "KINSetUserData", 1)) { return (1); }
    flag = KINSetConstraints(kmem, constraints);
    if (check_flag(&flag, "KINSetConstraints", 1)) { return (1); }
    flag = KINSetFuncNormTol(kmem, fnormtol);
    if (check_flag(&flag, "KINSetFuncNormTol", 1)) { return (1); }
    flag = KINSetScaledStepTol(kmem, scsteptol);
    if (check_flag(&flag, "KINSetScaledStepTol", 1)) { return (1); }

    /* Attach a linear solver module */
    switch (linsolver)
    {
    /* (a) SPGMR */
    case (USE_SPGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPGMR |\n");
      printf(" -------\n");

      /* Create SUNLinSol_SPGMR object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 15;
      LS   = SUNLinSol_SPGMR(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      /* Set the maximum number of restarts */
      maxlrst = 2;
      flag    = SUNLinSol_SPGMRSetMaxRestarts(LS, maxlrst);
      if (check_flag(&flag, "SUNLinSol_SPGMRSetMaxRestarts", 1)) { return (1); }

      break;

    /* (b) SPBCGS */
    case (USE_SPBCGS):

      /* Print header */
      printf(" --------");
      printf(" \n| SPBCGS |\n");
      printf(" --------\n");

      /* Create SUNLinSol_SPBCGS object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 15;
      LS   = SUNLinSol_SPBCGS(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPBCGS", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      break;

    /* (c) SPTFQMR */
    case (USE_SPTFQMR):

      /* Print header */
      printf(" ---------");
      printf(" \n| SPTFQMR |\n");
      printf(" ---------\n");

      /* Create SUNLinSol_SPTFQMR object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 25;
      LS   = SUNLinSol_SPTFQMR(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPTFQMR", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      break;

    /* (d) SPFGMR */
    case (USE_SPFGMR):

      /* Print header */
      printf(" -------");
      printf(" \n| SPFGMR |\n");
      printf(" -------\n");

      /* Create SUNLinSol_SPFGMR object with right preconditioning and the
         maximum Krylov dimension maxl */
      maxl = 15;
      LS   = SUNLinSol_SPFGMR(cc, SUN_PREC_RIGHT, maxl, sunctx);
      if (check_flag((void*)LS, "SUNLinSol_SPFGMR", 0)) { return (1); }

      /* Attach the linear solver to KINSOL */
      flag = KINSetLinearSolver(kmem, LS, NULL);
      if (check_flag(&flag, "KINSetLinearSolver", 1)) { return 1; }

      /* Set the maximum number of restarts */
      maxlrst = 2;
      flag    = SUNLinSol_SPGMRSetMaxRestarts(LS, maxlrst);
      if (check_flag(&flag, "SUNLinSol_SPGMRSetMaxRestarts", 1)) { return (1); }

      break;
    }

    /* Set preconditioner functions */
    flag = KINSetPreconditioner(kmem, PrecSetupBD, PrecSolveBD);
    if (check_flag(&flag, "KINSetPreconditioner", 1)) { return (1); }

    /* Print out the problem size, solution parameters, initial guess. */
    PrintHeader(globalstrategy, maxl, maxlrst, fnormtol, scsteptol, linsolver);

    /* Call KINSol and print output concentration profile */
    flag = KINSol(kmem,           /* KINSol memory block */
                  cc,             /* initial guess on input; solution vector */
                  globalstrategy, /* global strategy choice */
                  sc,             /* scaling vector, for the variable cc */
                  sc);            /* scaling vector for function values fval */
    if (check_flag(&flag, "KINSol", 1)) { return (1); }

    printf("\n\nComputed equilibrium species concentrations:\n");
    PrintOutput(cc);

    /* Print final statistics and free memory */
    PrintFinalStats(kmem, linsolver);

    KINFree(&kmem);
    SUNLinSolFree(LS);

  } /* END: Loop through SPGMR, SPBCGS, SPTFQMR, and SPFGMR linear solver modules */

  N_VDestroy(constraints);
  N_VDestroy(cc);
  N_VDestroy(sc);
  FreeUserData(data);

  SUNContext_Free(&sunctx);
  return (0);
}